

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
               (HighsDomainChange *param_1,undefined8 param_2,int param_3,byte param_4)

{
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_00;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_01;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_02;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_03;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_04;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_05;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_06;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_07;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_08;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_09;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  __b_10;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  HighsDomainChange *pHVar4;
  long lVar5;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  _Var6;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  pVar7;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  pivot_pos;
  pair<__gnu_cxx::__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  byte local_311;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_118 [2];
  HighsDomainChange *local_108;
  HighsDomainChange *local_100;
  HighsDomainChange *local_f8;
  HighsDomainChange *local_f0;
  HighsDomainChange *local_e8;
  HighsDomainChange *local_d8;
  HighsDomainChange *local_d0;
  HighsDomainChange *local_c8;
  HighsDomainChange *local_b8;
  HighsDomainChange *local_b0;
  HighsDomainChange *local_a8;
  HighsDomainChange *local_98;
  HighsDomainChange *local_90;
  HighsDomainChange *local_88;
  HighsDomainChange *local_78;
  HighsDomainChange *local_70;
  HighsDomainChange *local_68;
  long local_60;
  undefined8 local_50;
  HighsDomainChange *local_48;
  undefined8 local_38;
  HighsDomainChange *local_30;
  difference_type local_28;
  byte local_19;
  int local_18;
  undefined8 local_10;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_8;
  
  local_19 = param_4 & 1;
  local_18 = param_3;
  local_10 = param_2;
  local_8._M_current = param_1;
  do {
    while( true ) {
      local_28 = __gnu_cxx::operator-
                           ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                             *)in_stack_fffffffffffffcd0._M_current,
                            (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                             *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
      if (local_28 < 0x18) {
        if ((local_19 & 1) == 0) {
          local_48 = local_8._M_current;
          local_50 = local_10;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                    (local_8._M_current,local_10);
        }
        else {
          local_30 = local_8._M_current;
          local_38 = local_10;
          insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                    (local_8._M_current,local_10);
        }
        return;
      }
      local_60 = local_28 / 2;
      if (local_28 < 0x81) {
        local_f8 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_100 = local_8._M_current;
        local_108 = (HighsDomainChange *)
                    __gnu_cxx::
                    __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                    ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_f8,local_100,local_108);
      }
      else {
        local_68 = local_8._M_current;
        local_70 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_78 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_68,local_70,local_78);
        local_88 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_90 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_98 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_88,local_90,local_98);
        local_a8 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b0 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_b8 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_a8,local_b0,local_b8);
        local_c8 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d0 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        local_d8 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        sort3<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_c8,local_d0,local_d8);
        local_e8 = local_8._M_current;
        local_f0 = (HighsDomainChange *)
                   __gnu_cxx::
                   __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                   ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                               in_stack_fffffffffffffcd0._M_current);
        _Var6._M_current._7_1_ = in_stack_fffffffffffffccf;
        _Var6._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                  (in_stack_fffffffffffffcd0,_Var6);
      }
      local_311 = 0;
      if ((local_19 & 1) == 0) {
        local_118[0] = __gnu_cxx::
                       __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                                   in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator*(local_118);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator*(&local_8);
        bVar1 = std::less<HighsDomainChange>::operator()
                          ((less<HighsDomainChange> *)in_stack_fffffffffffffcd0._M_current,
                           (HighsDomainChange *)
                           CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                           (HighsDomainChange *)0x5f6642);
        local_311 = bVar1 ^ 0xff;
      }
      if ((local_311 & 1) == 0) break;
      partition_left<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                (local_8._M_current,local_10);
      local_8 = __gnu_cxx::
                __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                             *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                            in_stack_fffffffffffffcd0._M_current);
    }
    pVar7 = partition_right<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                      (local_8._M_current,local_10);
    dVar3 = __gnu_cxx::operator-
                      ((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                        *)in_stack_fffffffffffffcd0._M_current,
                       (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                        *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    __gnu_cxx::
    __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
    ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                (difference_type)in_stack_fffffffffffffcd0._M_current);
    pHVar4 = (HighsDomainChange *)
             __gnu_cxx::operator-
                       (in_stack_fffffffffffffcd0._M_current,
                        (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                         *)CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8));
    lVar5 = local_28 / 8;
    bVar1 = lVar5 <= dVar3;
    if (bVar1) {
      lVar5 = local_28 % 8;
      in_stack_fffffffffffffcd0._M_current = pHVar4;
    }
    bVar1 = !bVar1;
    bVar2 = (long)pHVar4 < local_28 / 8;
    in_stack_fffffffffffffcdf = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      local_18 = local_18 + -1;
      if (local_18 == 0) {
        std::
        make_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_8._M_current,local_10);
        std::
        sort_heap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                  (local_8._M_current,local_10);
        return;
      }
      if (0x17 < dVar3) {
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                  (in_stack_fffffffffffffcd0,__b);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_00._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_00._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                  (in_stack_fffffffffffffcd0,__b_00);
        if (0x80 < dVar3) {
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_01._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_01._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_01);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_02._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_02._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_02);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_03._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_03._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_03);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_04._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_04._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_04);
        }
      }
      if (0x17 < (long)pHVar4) {
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_05._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_05._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                  (in_stack_fffffffffffffcd0,__b_05);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __gnu_cxx::
        __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
        ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                     *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                    (difference_type)in_stack_fffffffffffffcd0._M_current);
        __b_06._M_current._7_1_ = in_stack_fffffffffffffccf;
        __b_06._M_current._0_7_ = in_stack_fffffffffffffcc8;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                  (in_stack_fffffffffffffcd0,__b_06);
        if (0x80 < (long)pHVar4) {
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_07._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_07._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_07);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_08._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_08._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_08);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_09._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_09._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_09);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
          ::operator-((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                       *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                      (difference_type)in_stack_fffffffffffffcd0._M_current);
          __b_10._M_current._7_1_ = in_stack_fffffffffffffccf;
          __b_10._M_current._0_7_ = in_stack_fffffffffffffcc8;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>>
                    (in_stack_fffffffffffffcd0,__b_10);
        }
      }
    }
    else {
      bVar1 = false;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                          (local_8._M_current,pVar7.first._M_current._M_current,lVar5);
        bVar1 = false;
        if (bVar2) {
          _Var6 = __gnu_cxx::
                  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                  ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                              in_stack_fffffffffffffcd0._M_current);
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>>
                            (_Var6._M_current,local_10);
        }
      }
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffccf = 0;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsDomainChange*,std::vector<HighsDomainChange,std::allocator<HighsDomainChange>>>,std::less<HighsDomainChange>,false>
              (local_8._M_current,pVar7.first._M_current._M_current,local_18,local_19 & 1);
    local_8 = __gnu_cxx::
              __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
              ::operator+((__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                           *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                          in_stack_fffffffffffffcd0._M_current);
    local_19 = 0;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }